

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void cvarfunc_vid_winscale(FFloatCVar *self)

{
  if (self->Value < 1.0) {
    FFloatCVar::operator=(self,1.0);
    return;
  }
  if (Video != (IVideo *)0x0) {
    (*Video->_vptr_IVideo[3])();
    NewWidth = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    NewHeight = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    NewBits = DisplayBits;
    setmodeneeded = true;
  }
  return;
}

Assistant:

inline operator float () const { return Value; }